

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

bool tinyusdz::tydra::(anonymous_namespace)::(anonymous_namespace)::
     ScalarValueToVertexAttribute<std::array<unsigned_char,2ul>>
               (Value *value,string *name,VertexAttributeFormat format,VertexAttribute *dst,
               string *err)

{
  size_t sVar1;
  ostream *poVar2;
  array<unsigned_char,_2UL> *paVar3;
  uchar *puVar4;
  string local_370 [32];
  ostringstream local_350 [8];
  ostringstream ss_e_1;
  array<unsigned_char,_2UL> *pv;
  ostringstream local_1b0 [8];
  ostringstream ss_e;
  string *err_local;
  VertexAttribute *dst_local;
  VertexAttributeFormat format_local;
  string *name_local;
  Value *value_local;
  
  sVar1 = VertexAttributeFormatSize(format);
  if (sVar1 == 2) {
    paVar3 = tinyusdz::value::Value::as<std::array<unsigned_char,2ul>>(value,false);
    if (paVar3 == (array<unsigned_char,_2UL> *)0x0) {
      ::std::__cxx11::ostringstream::ostringstream(local_350);
      poVar2 = ::std::operator<<((ostream *)local_350,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ScalarValueToVertexAttribute");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x4a2);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_350,
                                 "[Internal error] value is not scalar-typed value.");
      ::std::operator<<(poVar2,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,local_370);
        ::std::__cxx11::string::~string(local_370);
      }
      value_local._7_1_ = false;
      ::std::__cxx11::ostringstream::~ostringstream(local_350);
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data,2);
      puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&dst->data);
      *(undefined2 *)puVar4 = *(undefined2 *)paVar3->_M_elems;
      dst->elementSize = 1;
      dst->stride = 0;
      dst->format = format;
      dst->variability = Constant;
      ::std::__cxx11::string::operator=((string *)dst,(string *)name);
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&dst->indices);
      value_local._7_1_ = true;
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar2 = ::std::operator<<((ostream *)local_1b0,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ScalarValueToVertexAttribute");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x491);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1b0,"format size mismatch.");
    ::std::operator<<(poVar2,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,(string *)&pv);
      ::std::__cxx11::string::~string((string *)&pv);
    }
    value_local._7_1_ = false;
    ::std::__cxx11::ostringstream::~ostringstream(local_1b0);
  }
  return value_local._7_1_;
}

Assistant:

bool ScalarValueToVertexAttribute(const value::Value &value,
                                  const std::string &name,
                                  const VertexAttributeFormat format,
                                  VertexAttribute &dst, std::string *err) {
  if (VertexAttributeFormatSize(format) != sizeof(UnderlyingTy)) {
    PUSH_ERROR_AND_RETURN("format size mismatch.");
    return false;
  }

  if (auto pv = value.as<UnderlyingTy>()) {
    dst.data.resize(sizeof(UnderlyingTy));
    memcpy(dst.data.data(), pv, sizeof(UnderlyingTy));

    dst.elementSize = 1;
    dst.stride = 0;
    dst.format = format;
    dst.variability = VertexVariability::Constant;
    dst.name = name;
    dst.indices.clear();
    return true;
  }

  PUSH_ERROR_AND_RETURN("[Internal error] value is not scalar-typed value.");
}